

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# HwlocCpuInfo.cpp
# Opt level: O0

bool __thiscall xmrig::HwlocCpuInfo::membind(HwlocCpuInfo *this,hwloc_const_bitmap_t nodeset)

{
  int iVar1;
  long lVar2;
  undefined8 in_RSI;
  long in_RDI;
  undefined1 local_1;
  
  lVar2 = hwloc_topology_get_support(*(undefined8 *)(in_RDI + 0x78));
  if (*(char *)(*(long *)(lVar2 + 0x10) + 4) == '\0') {
    local_1 = false;
  }
  else {
    iVar1 = hwloc_set_membind(*(undefined8 *)(in_RDI + 0x78),in_RSI,2,0x22);
    local_1 = -1 < iVar1;
  }
  return local_1;
}

Assistant:

bool xmrig::HwlocCpuInfo::membind(hwloc_const_bitmap_t nodeset)
{
    if (!hwloc_topology_get_support(m_topology)->membind->set_thisthread_membind) {
        return false;
    }

#   if HWLOC_API_VERSION >= 0x20000
    return hwloc_set_membind(m_topology, nodeset, HWLOC_MEMBIND_BIND, HWLOC_MEMBIND_THREAD | HWLOC_MEMBIND_BYNODESET) >= 0;
#   else
    return hwloc_set_membind_nodeset(m_topology, nodeset, HWLOC_MEMBIND_BIND, HWLOC_MEMBIND_THREAD) >= 0;
#   endif
}